

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vec3 __thiscall djb::npf::uberTextureLookup(npf *this,vec2 *uv)

{
  pointer pvVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer pvVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  vec3 vVar8;
  
  uVar5 = (uint)(uv->x * 512.0);
  uVar7 = 0x1ff;
  if ((int)uVar5 < 0x1ff) {
    uVar7 = uVar5;
  }
  uVar5 = 0;
  if (0 < (int)uVar7) {
    uVar5 = uVar7;
  }
  uVar6 = (ulong)uVar5 | (long)this->m_id << 9;
  pvVar4 = (this->m_uber_texture).super__Vector_base<djb::vec3,_std::allocator<djb::vec3>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar1 = pvVar4 + uVar6;
  uVar2 = pvVar1->x;
  uVar3 = pvVar1->y;
  vVar8.y = (float_t)uVar3;
  vVar8.x = (float_t)uVar2;
  vVar8.z = pvVar4[uVar6].z;
  return vVar8;
}

Assistant:

vec3 npf::uberTextureLookup(const vec2 &uv) const
{
#if 0
	vec3 color = spline::eval2d(m_uber_texture, 512, 256,
	                            spline::uwrap_edge, uv.x,
	                            spline::uwrap_edge, uv.y);
	return color;
#else
	int i1 = uv.x * 512; if (i1 > 511) i1 = 511; if (i1 < 0) i1 = 0;
	int i2 = m_id;
	int idx = i1 + 512 * i2;
	return m_uber_texture[idx];
#endif
}